

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRSInterface.cpp
# Opt level: O0

int connectrazorahrsinterface(RS232PORT *pRazorAHRSInterfacePseudoRS232Port)

{
  int iVar1;
  RS232PORT *pRazorAHRSInterfacePseudoRS232Port_local;
  
  iVar1 = OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port,szRazorAHRSInterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pRazorAHRSInterfacePseudoRS232Port,RazorAHRSInterfaceBaudRate,'\0',0
                                ,'\b','\0',RazorAHRSInterfaceTimeout);
    if (iVar1 == 0) {
      printf("RazorAHRSInterface connected.\n");
      pRazorAHRSInterfacePseudoRS232Port_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a RazorAHRSInterface.\n");
      CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
      pRazorAHRSInterfacePseudoRS232Port_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a RazorAHRSInterface.\n");
    pRazorAHRSInterfacePseudoRS232Port_local._4_4_ = 1;
  }
  return pRazorAHRSInterfacePseudoRS232Port_local._4_4_;
}

Assistant:

int connectrazorahrsinterface(RS232PORT* pRazorAHRSInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pRazorAHRSInterfacePseudoRS232Port, szRazorAHRSInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pRazorAHRSInterfacePseudoRS232Port, RazorAHRSInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)RazorAHRSInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a RazorAHRSInterface.\n");
		CloseRS232Port(pRazorAHRSInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("RazorAHRSInterface connected.\n");

	return EXIT_SUCCESS;
}